

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::removeTimedEvent(Timer *this,Event *ev)

{
  iterator iVar1;
  iterator node;
  TimerNode timer;
  AutoLock _auto_lock_;
  Node *local_80;
  iterator local_78;
  SmartPtr<Event> local_70;
  IEventDispatcher *local_68;
  TimerListener *pTStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  AutoLock local_48;
  
  local_70.mObj = (Event *)0x0;
  AutoLock::AutoLock(&local_48,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0x186);
  iVar1.mNode = ((this->mList).mHead)->next;
  if (iVar1.mNode != (this->mList).mTail) {
    local_80 = iVar1.mNode;
    do {
      SmartPtr<Event>::operator=(&local_70,((iVar1.mNode)->val).mEvent.mObj);
      local_68 = ((iVar1.mNode)->val).mDispatcher;
      pTStack_60 = ((iVar1.mNode)->val).mListener;
      local_58._0_4_ = ((iVar1.mNode)->val).mPrivateData;
      local_58._4_4_ = ((iVar1.mNode)->val).mTick;
      uStack_50._0_4_ = ((iVar1.mNode)->val).mRepeatMS;
      uStack_50._4_4_ = ((iVar1.mNode)->val).mRemainingMS;
      if (local_70.mObj == ev) {
        JetHead::list<Timer::TimerNode>::iterator::erase(&local_78);
        iVar1.mNode = local_78.mNode;
        local_80 = local_78.mNode;
      }
      else if (local_80 == (Node *)0x0) {
        iVar1.mNode = (Node *)0x0;
      }
      else {
        local_80 = local_80->next;
        iVar1.mNode = local_80;
      }
    } while (iVar1.mNode != (this->mList).mTail);
  }
  AutoLock::~AutoLock(&local_48);
  SmartPtr<Event>::~SmartPtr(&local_70);
  return;
}

Assistant:

void Timer::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	TimerNode timer;
	
	DebugAutoLock( mMutex );

	JetHead::list<TimerNode>::iterator node = mList.begin();
	while (node != mList.end())
	{
		// Cast the node as a TimerNode
		timer = *node;
		
		// Check if the timer node has an event for the dispatcher
		// specified
		if ( (Event*)timer.mEvent == ev )
		{
			node = node.erase();
			continue;
		}
		++node;
	}	
}